

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O1

void __thiscall KalmanFilter::~KalmanFilter(KalmanFilter *this)

{
  ~KalmanFilter(this);
  operator_delete(this);
  return;
}

Assistant:

KalmanFilter::~KalmanFilter() {}